

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::item::assign
          (item *this,entry *v,span<const_char> salt,sequence_number seq,public_key *pk,
          secret_key *sk)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  span<char> out;
  int iVar4;
  secret_key *sk_00;
  span<const_char> msg;
  span<const_char> v_00;
  array<char,_1249UL> buffer;
  char str [1449];
  signature local_b09;
  char local_ac9 [1249];
  char *local_5e8 [183];
  
  local_5e8[0] = local_ac9;
  sk_00 = (secret_key *)pk;
  iVar4 = detail::bencode_recursive<char*>(local_5e8,v);
  v_00.m_len = (long)iVar4;
  out.m_len = 0x5a9;
  out.m_ptr = (char *)local_5e8;
  v_00.m_ptr = local_ac9;
  iVar4 = anon_unknown_8::canonical_string(v_00,seq,salt,out);
  msg.m_ptr = (char *)(long)iVar4;
  msg.m_len = (difference_type)pk;
  ed25519_sign(&local_b09,(dht *)local_5e8,msg,(public_key *)sk,sk_00);
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x30) = local_b09.bytes._M_elems._48_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x38) = local_b09.bytes._M_elems._56_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x20) = local_b09.bytes._M_elems._32_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x28) = local_b09.bytes._M_elems._40_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x10) = local_b09.bytes._M_elems._16_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x18) = local_b09.bytes._M_elems._24_8_;
  *(undefined8 *)(this->m_sig).bytes._M_elems = local_b09.bytes._M_elems._0_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 8) = local_b09.bytes._M_elems._8_8_;
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_salt,0,(char *)(this->m_salt)._M_string_length,(ulong)salt.m_ptr);
  uVar1 = *(undefined8 *)((pk->bytes)._M_elems + 8);
  uVar2 = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
  uVar3 = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
  *(undefined8 *)(this->m_pk).bytes._M_elems = *(undefined8 *)(pk->bytes)._M_elems;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 8) = uVar1;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x10) = uVar2;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x18) = uVar3;
  (this->m_seq).value = seq.value;
  this->m_mutable = true;
  entry::operator=(&this->m_value,v);
  return;
}

Assistant:

void item::assign(entry v, span<char const> salt
	, sequence_number const seq, public_key const& pk, secret_key const& sk)
{
	std::array<char, MAX_DHT_MUTABLE_DATA_LENGTH> buffer;
	int const bsize = bencode(buffer.begin(), v);
	TORRENT_ASSERT(bsize <= static_cast<int>(MAX_DHT_MUTABLE_DATA_LENGTH));
	m_sig = sign_mutable_item(span<char const>(buffer).first(bsize)
		, salt, seq, pk, sk);
	m_salt.assign(salt.data(), static_cast<std::size_t>(salt.size()));
	m_pk = pk;
	m_seq = seq;
	m_mutable = true;
	m_value = std::move(v);
}